

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O2

void test_all_maps<HashObject<16,16>>(int obj_size,int iters)

{
  double dVar1;
  iterator iVar2;
  bool bVar3;
  int i;
  long lVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  uint *puVar7;
  iterator iVar8;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  size_t sVar11;
  ulong uVar12;
  undefined1 *puVar13;
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *this;
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *this_00;
  size_type sVar14;
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *this_02;
  size_type *end_memory;
  size_t start_memory;
  size_t start_memory_00;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  size_t start_memory_05;
  size_t start_memory_06;
  size_t start_memory_07;
  size_t start_memory_08;
  size_t start_memory_09;
  size_t start_memory_10;
  size_t start_memory_11;
  size_t start_memory_12;
  size_t start_memory_13;
  size_t start_memory_14;
  size_t start_memory_15;
  size_t start_memory_16;
  size_t start_memory_17;
  size_t start_memory_18;
  size_t start_memory_19;
  size_t start_memory_20;
  size_t start_memory_21;
  size_t start_memory_22;
  size_t start_memory_23;
  size_t start_memory_24;
  size_t start_memory_25;
  size_t start_memory_26;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  size_type req_elements;
  float *pfVar18;
  ulong uVar19;
  undefined1 local_198 [8];
  two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>_>
  tStack_190;
  iterator iStack_170;
  iterator local_168;
  iterator iStack_160;
  nonempty_iterator local_158;
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> set;
  pointer local_e8;
  Rusage t;
  iterator iStack_d0;
  iterator iStack_b0;
  iterator local_a8;
  iterator iStack_a0;
  nonempty_iterator local_98;
  double local_90;
  Rusage t_3;
  Rusage t_13;
  char acStack_70 [4];
  int iStack_6c;
  iterator local_68;
  
  uVar16 = 0;
  sVar11 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",0x10);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar17 = 0;
  if (0 < obj_size) {
    uVar17 = obj_size;
  }
  while (uVar17 != uVar16) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    pvVar5->second = uVar16;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_grow",dVar1,obj_size,start_memory,sVar11);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    pvVar5->second = uVar16;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar1,obj_size,start_memory_00,sVar11);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    pvVar5->second = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    pvVar5->second = uVar16;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_replace",dVar1,obj_size,start_memory_01,sVar11);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  uVar19 = (ulong)uVar17;
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseSparseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  puVar13 = (undefined1 *)
            set.
            super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
            enlarge_threshold_;
  time_map_fetch<EasyUseSparseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t_3);
  Rusage::Reset(&t_3);
  uVar16 = 1;
  for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    puVar13 = (undefined1 *)((long)&t_13.start_.__d.__r + 4);
    t_13.start_.__d.__r._4_4_ = (int)lVar4;
    acStack_70 = SUB84((ulong)lVar4 >> 0x20,0);
    iStack_6c = t_13.start_.__d.__r._4_4_;
    t_13.start_.__d.__r._0_4_ = uVar15;
    google::
    sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
    ::find<HashObject<16,16>>
              ((iterator *)local_198,
               (sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                *)&set,(HashObject<16,_16> *)&t_13);
    google::
    sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::end((iterator *)&t,
          (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)&set);
    bVar3 = google::
            two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>_>
            ::operator!=(&tStack_190,&iStack_d0);
    uVar16 = uVar16 ^ bVar3;
  }
  local_90 = Rusage::UserTime(&t_3);
  srand(uVar16);
  report("map_fetch_empty",local_90,obj_size,start_memory_02,(size_t)puVar13);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    pvVar5->second = uVar16;
  }
  Rusage::Reset(&t);
  for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    google::
    sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::erase((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)&set,(key_type *)local_198);
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_remove",dVar1,obj_size,start_memory_03,(size_t)puVar13);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  this = (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
          *)&set;
  local_90 = (double)CONCAT44(local_90._4_4_,uVar17);
  uVar16 = uVar17;
  uVar15 = 0;
  while (bVar3 = uVar17 != 0, uVar17 = uVar17 - 1, bVar3) {
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar15;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)this,(key_type *)local_198);
    pvVar5->second = uVar15 + 1;
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    local_198._0_4_ = uVar15;
    tStack_190.row_begin._M_current._4_4_ = local_198._4_4_;
    google::
    sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::erase(this,(key_type *)local_198);
    uVar16 = local_90._0_4_;
    uVar15 = uVar15 + 1;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_toggle",dVar1,obj_size,start_memory_04,(size_t)this);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap(&set);
  Rusage::Rusage(&t_3);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    pvVar5 = google::
             sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::
             find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    pvVar5->second = uVar17;
  }
  Rusage::Reset(&t_3);
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::begin((iterator *)&t,
          (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)&set);
  local_198._0_4_ = (undefined4)t.start_.__d.__r;
  local_198._4_4_ = t.start_.__d.__r._4_4_;
  tStack_190.row_begin._M_current._0_4_ = SUB84(iStack_d0.row_begin._M_current,0);
  tStack_190.row_begin._M_current._4_4_ =
       (undefined4)((ulong)iStack_d0.row_begin._M_current >> 0x20);
  tStack_190.row_end._M_current = iStack_d0.row_end._M_current;
  tStack_190.row_current._M_current = iStack_d0.row_current._M_current;
  tStack_190.col_current = iStack_d0.col_current;
  iStack_170._M_current = iStack_b0._M_current;
  local_168._M_current = local_a8._M_current;
  iStack_160._M_current = iStack_a0._M_current;
  local_158 = local_98;
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::end((iterator *)&t_13,
        (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
         *)&set);
  t.start_.__d.__r._4_4_ = t_13.start_.__d.__r._4_4_;
  t.start_.__d.__r._0_4_ = (uint)t_13.start_.__d.__r;
  iStack_d0.row_begin._M_current =
       (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        *)CONCAT44(iStack_6c,acStack_70);
  iStack_d0.row_end._M_current = local_68._M_current;
  uVar17 = 1;
  while( true ) {
    bVar3 = google::
            const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>_>
            ::operator!=((const_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>_>
                          *)&tStack_190,(iterator *)&iStack_d0);
    if (!bVar3) break;
    uVar17 = uVar17 ^ (tStack_190.col_current)->second;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::operator++((sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  *)local_198);
  }
  dVar1 = Rusage::UserTime(&t_3);
  srand(uVar17);
  report("map_iterate",dVar1,obj_size,start_memory_05,(size_t)this);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.table.groups);
  uVar17 = 0;
  sVar11 = (size_t)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",0x10);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar16 != uVar17) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(HashObject<16,_16> *)local_198);
    uVar17 = uVar17 + 1;
    pvVar6->second = uVar17;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_grow",dVar1,obj_size,start_memory_06,sVar11);
  free(local_e8);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  google::
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(HashObject<16,_16> *)local_198);
    uVar17 = uVar17 + 1;
    pvVar6->second = uVar17;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar1,obj_size,start_memory_07,sVar11);
  free(local_e8);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(HashObject<16,_16> *)local_198);
    uVar17 = uVar17 + 1;
    pvVar6->second = uVar17;
  }
  Rusage::Reset(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    sVar11 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(HashObject<16,_16> *)local_198);
    uVar17 = uVar17 + 1;
    pvVar6->second = uVar17;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_replace",dVar1,obj_size,start_memory_08,sVar11);
  free(local_e8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t_3);
  Rusage::Reset(&t_3);
  uVar17 = 1;
  uVar12 = set.
           super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
           enlarge_threshold_;
  for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    t_13.start_.__d.__r._4_4_ = (uVar15 & 0xff) * 0x1010101;
    t_13.start_.__d.__r._0_4_ = uVar15;
    google::
    dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
    ::find<HashObject<16,16>>
              ((iterator *)local_198,
               (dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                *)&set,(HashObject<16,_16> *)&t_13);
    google::
    dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::end((iterator *)&t,
          (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)&set);
    bVar3 = (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)CONCAT44(tStack_190.row_begin._M_current._4_4_,tStack_190.row_begin._M_current._0_4_)
            != iStack_d0.row_begin._M_current;
    uVar12 = (ulong)bVar3;
    uVar17 = uVar17 ^ bVar3;
  }
  dVar1 = Rusage::UserTime(&t_3);
  srand(uVar17);
  report("map_fetch_empty",dVar1,obj_size,start_memory_09,uVar12);
  free(local_e8);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    uVar12 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(HashObject<16,_16> *)local_198);
    uVar17 = uVar17 + 1;
    pvVar6->second = uVar17;
  }
  Rusage::Reset(&t);
  for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    uVar12 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    google::
    dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::erase((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)&set,(key_type *)local_198);
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_remove",dVar1,obj_size,start_memory_10,uVar12);
  free(local_e8);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  this_00 = (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)&set;
  uVar17 = uVar16;
  uVar15 = 0;
  while (bVar3 = uVar16 != 0, uVar16 = uVar16 - 1, bVar3) {
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar15;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)this_00,(HashObject<16,_16> *)local_198);
    pvVar6->second = uVar15 + 1;
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    local_198._0_4_ = uVar15;
    tStack_190.row_begin._M_current._4_4_ = local_198._4_4_;
    google::
    dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::erase(this_00,(HashObject<16,_16> *)local_198);
    uVar17 = local_90._0_4_;
    uVar15 = uVar15 + 1;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_toggle",dVar1,obj_size,start_memory_11,(size_t)this_00);
  free(local_e8);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)&set);
  Rusage::Rusage(&t_13);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    pvVar6 = google::
             dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
             ::find_or_insert<int,HashObject<16,16>>
                       ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                         *)&set,(HashObject<16,_16> *)local_198);
    uVar16 = uVar16 + 1;
    pvVar6->second = uVar16;
  }
  Rusage::Reset(&t_13);
  google::
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::begin((iterator *)&t,
          (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)&set);
  local_198._0_4_ = (undefined4)t.start_.__d.__r;
  local_198._4_4_ = t.start_.__d.__r._4_4_;
  tStack_190.row_begin._M_current._0_4_ = SUB84(iStack_d0.row_begin._M_current,0);
  tStack_190.row_begin._M_current._4_4_ =
       (undefined4)((ulong)iStack_d0.row_begin._M_current >> 0x20);
  tStack_190.row_end._M_current = iStack_d0.row_end._M_current;
  google::
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::end((iterator *)&t,
        (dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
         *)&set);
  iVar2._M_current = iStack_d0.row_begin._M_current;
  uVar16 = 1;
  while( true ) {
    if ((sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
         *)CONCAT44(tStack_190.row_begin._M_current._4_4_,tStack_190.row_begin._M_current._0_4_) ==
        iVar2._M_current) break;
    uVar16 = uVar16 ^ *(uint *)&((sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                                  *)CONCAT44(tStack_190.row_begin._M_current._4_4_,
                                             tStack_190.row_begin._M_current._0_4_))[1].group;
    google::
    dense_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::operator++((dense_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  *)local_198);
  }
  dVar1 = Rusage::UserTime(&t_13);
  srand(uVar16);
  report("map_iterate",dVar1,obj_size,start_memory_12,(size_t)this_00);
  free(local_e8);
  uVar16 = 0;
  puVar13 = (undefined1 *)(ulong)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",0x10);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar17 != uVar16) {
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    puVar13 = local_198 + 4;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    *puVar7 = uVar16;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_grow",dVar1,obj_size,start_memory_13,(size_t)puVar13);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  Rusage::Rusage(&t);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)&set,req_elements);
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    *puVar7 = uVar16;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar1,obj_size,start_memory_14,(size_t)puVar13);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    *puVar7 = uVar16;
  }
  Rusage::Reset(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    *puVar7 = uVar16;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_replace",dVar1,obj_size,start_memory_15,(size_t)puVar13);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  sVar14 = set.
           super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
           enlarge_threshold_;
  time_map_fetch<EasyUseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar16 = 1;
  for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar15;
    iVar8 = std::
            _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&set,(key_type *)local_198);
    sVar14 = (size_type)
             (iVar8.super__Node_iterator_base<std::pair<const_HashObject<16,_16>,_int>,_true>._M_cur
             != (__node_type *)0x0);
    uVar16 = uVar16 ^ iVar8.
                      super__Node_iterator_base<std::pair<const_HashObject<16,_16>,_int>,_true>.
                      _M_cur != (__node_type *)0x0;
  }
  dVar1 = Rusage::UserTime(&t);
  srand(uVar16);
  report("map_fetch_empty",dVar1,obj_size,start_memory_16,sVar14);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    sVar14 = 0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    *puVar7 = uVar16;
  }
  Rusage::Reset(&t);
  for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
    sVar14 = 0x101010101010101;
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    std::
    _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&set,local_198);
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_remove",dVar1,obj_size,start_memory_17,sVar14);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  this_01 = (_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)&set;
  uVar16 = uVar17;
  uVar15 = 0;
  while( true ) {
    bVar3 = uVar17 == 0;
    uVar17 = uVar17 - 1;
    if (bVar3) break;
    lVar4 = ((ulong)uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar15;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_01,(key_type *)local_198);
    *puVar7 = uVar15 + 1;
    lVar4 = ((ulong)uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    local_198._0_4_ = uVar15;
    tStack_190.row_begin._M_current._4_4_ = local_198._4_4_;
    std::
    _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(this_01,(key_type *)local_198);
    uVar16 = local_90._0_4_;
    uVar15 = uVar15 + 1;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_toggle",dVar1,obj_size,start_memory_18,(size_t)this_01);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.num_deleted;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = 1;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.use_empty_
       = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = false;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._27_1_ = 0
  ;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.i_ = 0x3f800000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.num_deleted = 0;
  Rusage::Rusage(&t);
  pfVar18 = &set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_factor_;
  uVar17 = 0;
  while (uVar16 != uVar17) {
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    this_01 = (_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(local_198 + 4);
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    puVar7 = (uint *)std::__detail::
                     _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    *puVar7 = uVar17;
  }
  Rusage::Reset(&t);
  uVar17 = 1;
  while( true ) {
    pfVar18 = *(float **)pfVar18;
    if (pfVar18 == (float *)0x0) break;
    uVar17 = uVar17 ^ (uint)pfVar18[6];
  }
  dVar1 = Rusage::UserTime(&t);
  srand(uVar17);
  report("map_iterate",dVar1,obj_size,start_memory_19,(size_t)this_01);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&set);
  uVar17 = 0;
  puVar13 = (undefined1 *)(ulong)(uint)obj_size;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",0x10);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  while (uVar16 != uVar17) {
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    puVar13 = local_198 + 4;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    *puVar7 = uVar17;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_grow",dVar1,obj_size,start_memory_20,(size_t)puVar13);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    *puVar7 = uVar17;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_predict/grow",dVar1,obj_size,start_memory_21,(size_t)puVar13);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    *puVar7 = uVar17;
  }
  Rusage::Reset(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    puVar13 = (undefined1 *)0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    *puVar7 = uVar17;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_replace",dVar1,obj_size,start_memory_22,(size_t)puVar13);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  shuffle((vector<int,_std::allocator<int>_> *)&set);
  time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_random");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&set,req_elements,(allocator_type *)local_198);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    *(int *)(set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .enlarge_threshold_ + uVar12 * 4) = (int)uVar12;
  }
  sVar14 = set.
           super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
           enlarge_threshold_;
  time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)&set,"map_fetch_sequential");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  uVar17 = 1;
  for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar15;
    iVar9 = std::
            _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
            ::find((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                    *)&set,(key_type *)local_198);
    bVar3 = iVar9._M_node !=
            (_Base_ptr)
            &set.
             super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
             .shrink_threshold_;
    sVar14 = (size_type)bVar3;
    uVar17 = uVar17 ^ bVar3;
  }
  dVar1 = Rusage::UserTime(&t);
  srand(uVar17);
  report("map_fetch_empty",dVar1,obj_size,start_memory_23,sVar14);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  uVar17 = 0;
  while (uVar16 != uVar17) {
    sVar14 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)&set,(key_type *)local_198);
    uVar17 = uVar17 + 1;
    *puVar7 = uVar17;
  }
  Rusage::Reset(&t);
  for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    sVar14 = 0x101010101010101;
    lVar4 = (ulong)(uVar17 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar17;
    std::
    _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::erase((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)&set,(key_type *)local_198);
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_remove",dVar1,obj_size,start_memory_24,sVar14);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  Rusage::Reset(&t);
  this_02 = &set;
  uVar17 = uVar16;
  uVar15 = 0;
  while (bVar3 = uVar16 != 0, uVar16 = uVar16 - 1, bVar3) {
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar15;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)this_02,(key_type *)local_198);
    *puVar7 = uVar15 + 1;
    lVar4 = (ulong)(uVar15 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    local_198._0_4_ = uVar15;
    tStack_190.row_begin._M_current._4_4_ = local_198._4_4_;
    std::
    _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::erase((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
             *)this_02,(key_type *)local_198);
    uVar17 = local_90._0_4_;
    uVar15 = uVar15 + 1;
  }
  dVar1 = Rusage::UserTime(&t);
  report("map_toggle",dVar1,obj_size,start_memory_25,(size_t)this_02);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       shrink_threshold_ & 0xffffffff00000000;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = 0.0;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>._24_8_ =
       &set.
        super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
        shrink_threshold_;
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[4] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[5] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[6] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[7] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[8] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[9] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[10] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey.buffer_[0xb] = '\0';
  set.
  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  .rep.key_info.delkey._0_8_ =
       set.
       super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
       .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       _24_8_;
  Rusage::Rusage(&t);
  uVar16 = 0;
  while (uVar17 != uVar16) {
    lVar4 = (ulong)(uVar16 & 0xff) * 0x101010101010101;
    local_198._4_4_ = (undefined4)lVar4;
    tStack_190.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    tStack_190.row_begin._M_current._4_1_ = local_198[4];
    tStack_190.row_begin._M_current._5_1_ = local_198[5];
    tStack_190.row_begin._M_current._6_1_ = local_198[6];
    tStack_190.row_begin._M_current._7_1_ = local_198[7];
    local_198._0_4_ = uVar16;
    puVar7 = (uint *)std::
                     map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                     ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                   *)&set,(key_type *)local_198);
    uVar16 = uVar16 + 1;
    *puVar7 = uVar16;
  }
  Rusage::Reset(&t);
  uVar17 = 1;
  p_Var10 = (_Rb_tree_node_base *)
            set.
            super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            .rep.settings.super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
            _24_8_;
  while( true ) {
    end_memory = &set.
                  super_sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  .rep.settings.
                  super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
                  shrink_threshold_;
    if (p_Var10 == (_Rb_tree_node_base *)end_memory) break;
    uVar17 = uVar17 ^ *(uint *)&p_Var10[1]._M_left;
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  }
  local_90 = Rusage::UserTime(&t);
  srand(uVar17);
  report("map_iterate",local_90,obj_size,start_memory_26,(size_t)end_memory);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)&set);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}